

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ProcessDescriptor::ProcessDescriptor
          (ProcessDescriptor *this,ProcessDescriptor *param_1)

{
  undefined4 uVar1;
  int32_t iVar2;
  ProcessDescriptor *param_1_local;
  ProcessDescriptor *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ProcessDescriptor_009c2258;
  this->pid_ = param_1->pid_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->cmdline_,&param_1->cmdline_);
  ::std::__cxx11::string::string((string *)&this->process_name_,(string *)&param_1->process_name_);
  uVar1 = *(undefined4 *)&param_1->field_0x4c;
  this->process_priority_ = param_1->process_priority_;
  *(undefined4 *)&this->field_0x4c = uVar1;
  this->start_timestamp_ns_ = param_1->start_timestamp_ns_;
  iVar2 = param_1->legacy_sort_index_;
  this->chrome_process_type_ = param_1->chrome_process_type_;
  this->legacy_sort_index_ = iVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->process_labels_,&param_1->process_labels_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ProcessDescriptor::ProcessDescriptor(ProcessDescriptor&&) noexcept = default;